

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O2

double testExtendedKalmanFilterLTV(void)

{
  Scalar SVar1;
  result_type rVar2;
  double dVar3;
  double dVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  uint i;
  uint k;
  long lVar8;
  long lVar9;
  int iVar10;
  uint i_2;
  InputVector *u_k;
  bool bVar11;
  MeasureVector *pMStack_12a20;
  StateVector xh;
  StateVector x;
  StateVector error;
  StateVector SStack_12948;
  StateVector dx;
  double dStack_12900;
  KalmanFunctorLTV func;
  Pmatrix p;
  MeasureVector w;
  Qmatrix q;
  Rmatrix r1;
  Qmatrix q1;
  Rmatrix r;
  ekf f;
  InputVector uk [1001];
  lagged_fibonacci1279 gen_;
  MeasureVector yk [1000];
  StateVector xk [1001];
  
  stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::ExtendedKalmanFilter(&f,true);
  func.super_DynamicsFunctorBase._vptr_DynamicsFunctorBase =
       (_func_int **)&PTR_Matrix<double,1,1,0,1,1>_const__unsigned_int__0015d3c8;
  func.a.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  func.a.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  func.a.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func.c.
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  func.c.
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  func.c.
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Random();
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
            (&func.s_,(CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                       *)xk);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Random();
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (&func.n_,(CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                       *)xk);
  iVar10 = 0x3e9;
  pMStack_12a20 = yk;
  while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
    Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Random();
    gen_.i = 0;
    gen_._4_4_ = 0x3fe00000;
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                 *)yk,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
                       *)uk,(double *)&gen_);
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)xk,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>_>
                *)yk);
    std::
    vector<Eigen::Matrix<double,4,4,0,4,4>,Eigen::aligned_allocator<Eigen::Matrix<double,4,4,0,4,4>>>
    ::emplace_back<Eigen::Matrix<double,4,4,0,4,4>>
              ((vector<Eigen::Matrix<double,4,4,0,4,4>,Eigen::aligned_allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                *)&func.a,(Matrix<double,_4,_4,_0,_4,_4> *)xk);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::Random();
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,4,0,3,4>> *)xk,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                *)yk);
    std::
    vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
    ::emplace_back<Eigen::Matrix<double,3,4,0,3,4>>
              ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                *)&func.c,(Matrix<double,_3,_4,_0,_3,_4> *)xk);
  }
  f.f_ = &func.super_DynamicsFunctorBase;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&x,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&gen_);
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed(&gen_);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Random();
  q.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&q1,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
                      *)&p,(double *)&q);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&r1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&q1);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Random();
  p.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               *)&q,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
                     *)&error,(double *)&p);
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&q1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>_>
              *)&q);
  q.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&r1;
  q.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       q.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0];
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&r,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
              *)&q);
  p.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&q1;
  p.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       p.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0];
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&q,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>_>
              *)&p);
  Eigen::internal::call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>
            (xk,&x);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::Random();
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,1,1,0,1,1>>>
            (uk,(CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
                 *)&p);
  for (lVar9 = 1; lVar9 != 0x3e9; lVar9 = lVar9 + 1) {
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0
      ;
      xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
           1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)&error,(double *)&w,(double *)&xh);
      rVar2 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&error,&gen_);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)&p,lVar8);
      *pSVar5 = rVar2;
    }
    error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)&q1;
    error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)&p;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((Matrix<double,_4,_1,_0,_4,_1> *)
               error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
               array[1],(Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
                         *)&error);
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
           0.0;
      dx.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
           1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)&error,(double *)&xh,(double *)&dx);
      rVar2 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)&error,&gen_);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)&w,lVar8);
      *pSVar6 = rVar2;
    }
    error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)&r1;
    error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)&w;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&w,
               (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
                *)&error);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::Random();
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,1,0,1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,1,1,0,1,1>>>
              (uk + lVar9,
               (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
                *)&error);
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::stateDynamics(Eigen::
    Matrix<double,4,1,0,4,1>const&,Eigen::Matrix<double,1,1,0,1,1>_const__unsigned_int_
              (&error,&func,&x,(InputVector *)((long)(&f.xbar_ + 1) + lVar9 * 8 + 8),
               (uint)(lVar9 + -1));
    xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)&p;
    xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)&error;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Matrix<double,4,1,0,4,1>const>>
              (&x,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                   *)&xh);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>(xk + lVar9,&x);
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
    Matrix<double,4,1,0,4,1>const&,Eigen::Matrix<double,1,1,0,1,1>_const__unsigned_int_
              ((MeasureVector *)&xh,&func,&x,uk + lVar9,(uint)lVar9);
    error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (double)&xh;
    error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         (double)&w;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (yk + lVar9 + -1,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)&error);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Random();
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&xh,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&p);
  stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setState
            ((ZeroDelayObserver<4U,_3U,_1U> *)&f,&xh,0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&p,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&error);
  stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setStateCovariance
            (&f.super_KalmanFilterBase<4U,_3U,_1U>,&p);
  stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setR
            (&f.super_KalmanFilterBase<4U,_3U,_1U>,&r);
  stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setQ
            (&f.super_KalmanFilterBase<4U,_3U,_1U>,&q);
  stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
            ((ZeroDelayObserver<4U,_3U,_1U> *)&f,uk,0);
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)&xh,lVar9);
    SVar1 = *pSVar5;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)&p,lVar9,lVar9);
    *pSVar7 = SVar1;
  }
  error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (double)&p;
  error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (double)&p;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>,0>>
            ((Matrix<double,_4,_4,_0,_4,_4> *)&p,
             (Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
              *)&error);
  SStack_12948.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Constant
            ((ConstantReturnType *)&w,(Scalar *)&SStack_12948);
  dStack_12900 = 1e-08;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
               *)&error,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
               *)&w,&dStack_12900);
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&dx,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              *)&error);
  u_k = uk;
  for (lVar9 = -1000; u_k = u_k + 1, lVar9 != 0; lVar9 = lVar9 + 1) {
    k = (int)lVar9 + 0x3e9;
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setMeasurement
              ((ZeroDelayObserver<4U,_3U,_1U> *)&f,pMStack_12a20,k);
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
              ((ZeroDelayObserver<4U,_3U,_1U> *)&f,u_k,k);
    stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getAMatrixFD
              ((Amatrix *)&error,&f,&dx);
    stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getCMatrixFD
              ((Cmatrix *)&w,&f,&dx);
    stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setA
              (&f.super_KalmanFilterBase<4U,_3U,_1U>,(Amatrix *)&error);
    stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setC
              (&f.super_KalmanFilterBase<4U,_3U,_1U>,(Cmatrix *)&w);
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::getEstimatedState
              (&SStack_12948,(ZeroDelayObserver<4U,_3U,_1U> *)&f,k);
    xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         SStack_12948.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[0];
    xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         SStack_12948.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
         array[1];
    pMStack_12a20 = pMStack_12a20 + 1;
  }
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)(xk + 1000);
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&xh;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Matrix<double,4,1,0,4,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&error,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&w);
  dVar3 = error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
          [0] * error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array[0];
  dVar4 = error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
          [1] * error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array[1];
  testExtendedKalmanFilterLTV::KalmanFunctorLTV::~KalmanFunctorLTV(&func);
  stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::~ZeroDelayObserver
            ((ZeroDelayObserver<4U,_3U,_1U> *)&f);
  return SQRT(error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array[3] *
              error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array[3] + dVar4 +
              error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array[2] *
              error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array[2] + dVar3);
}

Assistant:

double testExtendedKalmanFilterLTV()
{
    const static unsigned kmax=1000;

    typedef stateObservation::compileTime::ExtendedKalmanFilter<4,3,1> ekf;


    struct KalmanFunctorLTV:
                public ekf::DynamicsFunctorBase
    {

public:
        KalmanFunctorLTV()
        {
            s_=ekf::StateVector::Random();
            n_=ekf::MeasureVector::Random();

            for (unsigned i=0;i<=kmax;++i)
            {
                a.push_back( ekf::Amatrix::Random()*0.5 );
                c.push_back( ekf::Cmatrix::Random() );
            }

        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            ekf::StateVector xk1;
            unsigned kk=std::min(k,kmax);
            xk1=a[kk]*x+(u*u.transpose())[0]*s_;

            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            unsigned kk=std::min(k,kmax);
            yk=c[kk]*x+(u*u.transpose())[0]*n_;
            return yk;
        }

        std::vector<ekf::Amatrix,Eigen::aligned_allocator<ekf::Amatrix> > a;
        std::vector<ekf::Cmatrix,Eigen::aligned_allocator<ekf::Cmatrix> > c;
private:
        ekf::StateVector s_;
        ekf::MeasureVector n_;
    };


    ekf f;

    ekf::Amatrix a;
    KalmanFunctorLTV func;

    f.setFunctor(&func);



    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector uk[kmax+1];

    ekf::StateVector x=ekf::StateVector::Zero();



    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=ekf::Rmatrix::Random()*0.01;

    ekf::Qmatrix q1=ekf::Qmatrix::Random()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;
    uk[0]=ekf::InputVector::Random();

    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v;
        for (unsigned i=0;i<ekf::stateSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w;
        for (unsigned i=0;i<ekf::measureSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        uk[k]=ekf::InputVector::Random();

        x=func.stateDynamics(x,uk[k-1],k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,uk[k],k)+w;

    }

    ekf::StateVector xh=ekf::StateVector::Random();

    f.setState(xh,0);

    ekf::Pmatrix p=ekf::Pmatrix::Zero();



    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    f.setInput(uk[0],0);

    for (unsigned i=0;i<ekf::stateSize;++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=ekf::StateVector::Constant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);
        f.setInput(uk[i],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);

        xh=f.getEstimatedState(i);
    }

    ekf::StateVector error(xh-xk[kmax]);

    return error.norm();

}